

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error doCdataSection(XML_Parser parser,ENCODING *enc,char **startPtr,char *end,char **nextPtr,
                        XML_Bool haveMore,XML_Account account)

{
  long lVar1;
  int iVar2;
  char *extraout_RDX;
  char **ppcVar3;
  _func_void_ENCODING_ptr_char_ptr_char_ptr_POSITION_ptr *p_Stack_78;
  XML_Convert_Result convert_res;
  ICHAR *dataPtr;
  XML_CharacterDataHandler charDataHandler;
  XML_Char c;
  char **ppcStack_60;
  int tok;
  char *next;
  char **eventEndPP;
  char **eventPP;
  char *s;
  char **ppcStack_38;
  XML_Bool haveMore_local;
  char **nextPtr_local;
  char *end_local;
  char **startPtr_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  eventPP = (char **)*startPtr;
  if (enc == parser->m_encoding) {
    eventEndPP = &parser->m_eventPtr;
    *eventEndPP = (char *)eventPP;
    next = (char *)&parser->m_eventEndPtr;
  }
  else {
    eventEndPP = &parser->m_openInternalEntities->internalEventPtr;
    next = (char *)&parser->m_openInternalEntities->internalEventEndPtr;
  }
  *eventEndPP = (char *)eventPP;
  *startPtr = (char *)0x0;
  s._7_1_ = haveMore;
  ppcStack_38 = nextPtr;
  nextPtr_local = (char **)end;
  end_local = (char *)startPtr;
  startPtr_local = (char **)enc;
  enc_local = (ENCODING *)parser;
  do {
    ppcStack_60 = eventPP;
    ppcVar3 = eventPP;
    charDataHandler._4_4_ =
         (*(code *)startPtr_local[2])(startPtr_local,eventPP,nextPtr_local,&stack0xffffffffffffffa0)
    ;
    *(char ***)next = ppcStack_60;
    switch(charDataHandler._4_4_) {
    case 0:
      *eventEndPP = (char *)ppcStack_60;
      return XML_ERROR_INVALID_TOKEN;
    case 6:
      dataPtr = *(ICHAR **)&enc_local->minBytesPerChar;
      if ((code *)dataPtr == (code *)0x0) {
        if (enc_local[1].literalScanners[1] != (SCANNER)0x0) {
          reportDefault((XML_Parser)enc_local,(ENCODING *)startPtr_local,(char *)eventPP,
                        (char *)ppcStack_60);
        }
      }
      else if (*(char *)((long)startPtr_local + 0x7c) == '\0') {
        while( true ) {
          p_Stack_78 = enc_local->updatePosition;
          iVar2 = (*(code *)startPtr_local[0xd])
                            (startPtr_local,&eventPP,ppcStack_60,&stack0xffffffffffffff88,
                             enc_local->isPublicId);
          *(char ***)next = ppcStack_60;
          (*(code *)dataPtr)(enc_local->scanners[1],enc_local->updatePosition,
                             (long)p_Stack_78 - (long)enc_local->updatePosition & 0xffffffff);
          if ((iVar2 == 0) || (iVar2 == 1)) break;
          *eventEndPP = (char *)eventPP;
        }
      }
      else {
        (*(code *)dataPtr)(enc_local->scanners[1],eventPP,
                           (long)ppcStack_60 - (long)eventPP & 0xffffffff);
      }
      break;
    case 7:
      lVar1._0_4_ = enc_local->minBytesPerChar;
      lVar1._4_1_ = enc_local->isUtf8;
      lVar1._5_1_ = enc_local->isUtf16;
      lVar1._6_2_ = *(undefined2 *)&enc_local->field_0x7e;
      if (lVar1 == 0) {
        if (enc_local[1].literalScanners[1] != (SCANNER)0x0) {
          reportDefault((XML_Parser)enc_local,(ENCODING *)startPtr_local,(char *)eventPP,
                        (char *)ppcStack_60);
        }
      }
      else {
        charDataHandler._3_1_ = 10;
        (**(code **)&enc_local->minBytesPerChar)
                  (enc_local->scanners[1],(long)&charDataHandler + 3,1);
      }
      break;
    case 0x28:
      if (enc_local[1].literalScanners[0] == (SCANNER)0x0) {
        if (enc_local[1].literalScanners[1] != (SCANNER)0x0) {
          reportDefault((XML_Parser)enc_local,(ENCODING *)startPtr_local,(char *)eventPP,
                        (char *)ppcStack_60);
        }
      }
      else {
        (*enc_local[1].literalScanners[0])
                  ((ENCODING *)enc_local->scanners[1],(char *)ppcVar3,extraout_RDX,
                   (char **)enc_local);
      }
      *(char ***)end_local = ppcStack_60;
      *ppcStack_38 = (char *)ppcStack_60;
      if (*(int *)&enc_local[6].utf16Convert == 2) {
        return XML_ERROR_ABORTED;
      }
      return XML_ERROR_NONE;
    case 0xfffffffc:
    case 0xffffffff:
      if (s._7_1_ != '\0') {
        *ppcStack_38 = (char *)eventPP;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_CDATA_SECTION;
    default:
      *eventEndPP = (char *)ppcStack_60;
      return XML_ERROR_UNEXPECTED_STATE;
    case 0xfffffffe:
      if (s._7_1_ != '\0') {
        *ppcStack_38 = (char *)eventPP;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    }
    eventPP = ppcStack_60;
    *eventEndPP = (char *)ppcStack_60;
    if (*(int *)&enc_local[6].utf16Convert == 2) {
      return XML_ERROR_ABORTED;
    }
  } while (*(int *)&enc_local[6].utf16Convert != 3);
  *ppcStack_38 = (char *)ppcStack_60;
  return XML_ERROR_NONE;
}

Assistant:

static enum XML_Error
doCdataSection(XML_Parser parser, const ENCODING *enc, const char **startPtr,
               const char *end, const char **nextPtr, XML_Bool haveMore,
               enum XML_Account account) {
  const char *s = *startPtr;
  const char **eventPP;
  const char **eventEndPP;
  if (enc == parser->m_encoding) {
    eventPP = &parser->m_eventPtr;
    *eventPP = s;
    eventEndPP = &parser->m_eventEndPtr;
  } else {
    eventPP = &(parser->m_openInternalEntities->internalEventPtr);
    eventEndPP = &(parser->m_openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;
  *startPtr = NULL;

  for (;;) {
    const char *next = s; /* in case of XML_TOK_NONE or XML_TOK_PARTIAL */
    int tok = XmlCdataSectionTok(enc, s, end, &next);
#ifdef XML_DTD
    if (! accountingDiffTolerated(parser, tok, s, next, __LINE__, account)) {
      accountingOnAbort(parser);
      return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
    }
#else
    UNUSED_P(account);
#endif
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_CDATA_SECT_CLOSE:
      if (parser->m_endCdataSectionHandler)
        parser->m_endCdataSectionHandler(parser->m_handlerArg);
      /* BEGIN disabled code */
      /* see comment under XML_TOK_CDATA_SECT_OPEN */
      else if (0 && parser->m_characterDataHandler)
        parser->m_characterDataHandler(parser->m_handlerArg, parser->m_dataBuf,
                                       0);
      /* END disabled code */
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      *startPtr = next;
      *nextPtr = next;
      if (parser->m_parsingStatus.parsing == XML_FINISHED)
        return XML_ERROR_ABORTED;
      else
        return XML_ERROR_NONE;
    case XML_TOK_DATA_NEWLINE:
      if (parser->m_characterDataHandler) {
        XML_Char c = 0xA;
        parser->m_characterDataHandler(parser->m_handlerArg, &c, 1);
      } else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_DATA_CHARS: {
      XML_CharacterDataHandler charDataHandler = parser->m_characterDataHandler;
      if (charDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          for (;;) {
            ICHAR *dataPtr = (ICHAR *)parser->m_dataBuf;
            const enum XML_Convert_Result convert_res = XmlConvert(
                enc, &s, next, &dataPtr, (ICHAR *)parser->m_dataBufEnd);
            *eventEndPP = next;
            charDataHandler(parser->m_handlerArg, parser->m_dataBuf,
                            (int)(dataPtr - (ICHAR *)parser->m_dataBuf));
            if ((convert_res == XML_CONVERT_COMPLETED)
                || (convert_res == XML_CONVERT_INPUT_INCOMPLETE))
              break;
            *eventPP = s;
          }
        } else
          charDataHandler(parser->m_handlerArg, (XML_Char *)s,
                          (int)((XML_Char *)next - (XML_Char *)s));
      } else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
    } break;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_PARTIAL:
    case XML_TOK_NONE:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_CDATA_SECTION;
    default:
      /* Every token returned by XmlCdataSectionTok() has its own
       * explicit case, so this default case will never be executed.
       * We retain it as a safety net and exclude it from the coverage
       * statistics.
       *
       * LCOV_EXCL_START
       */
      *eventPP = next;
      return XML_ERROR_UNEXPECTED_STATE;
      /* LCOV_EXCL_STOP */
    }

    *eventPP = s = next;
    switch (parser->m_parsingStatus.parsing) {
    case XML_SUSPENDED:
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_FINISHED:
      return XML_ERROR_ABORTED;
    default:;
    }
  }
  /* not reached */
}